

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteBlif.c
# Opt level: O3

void Bac_ManWriteBlifLines(FILE *pFile,Bac_Ntk_t *p)

{
  byte *pbVar1;
  uint uVar2;
  Bac_Ntk_t *pBVar3;
  byte bVar4;
  char *pcVar5;
  Mio_Library_t *pLib;
  Mio_Gate_t *pGate;
  char *pcVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  
  if (0 < (p->vType).nSize) {
    lVar9 = 1;
    uVar10 = 0xffffffffffffffff;
    lVar12 = 2;
    uVar14 = 0;
    do {
      bVar4 = (p->vType).pArray[uVar14];
      if (0xffffffbb < (bVar4 >> 1) - 0x49) {
        if ((bVar4 & 0xfe) == 0x78) {
          if (bVar4 < 10) {
LAB_0039da35:
            __assert_fail("Bac_ObjIsBox(p, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                          ,0x13d,"int Bac_BoxNtkId(Bac_Ntk_t *, int)");
          }
          if ((long)(p->vFanin).nSize <= (long)uVar14) {
LAB_0039da16:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          pcVar5 = Abc_NamStr(p->pDesign->pMods,(p->vFanin).pArray[uVar14]);
          pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
          pGate = Mio_LibraryReadGateByName(pLib,pcVar5,(char *)0x0);
          fprintf((FILE *)pFile,".gate %s",pcVar5);
          if (uVar14 != 0) {
            iVar8 = 0;
            uVar11 = uVar14 & 0xffffffff;
            uVar13 = uVar10;
            do {
              if ((p->vType).nSize < (int)uVar11) goto LAB_0039d9f7;
              if (((p->vType).pArray[uVar13 & 0xffffffff] & 0xfeU) != 6) break;
              pcVar5 = Mio_GateReadPinName(pGate,iVar8);
              pcVar6 = Bac_ObjNameStr(p,(int)uVar13);
              fprintf((FILE *)pFile," %s=%s",pcVar5,pcVar6);
              iVar8 = iVar8 + 1;
              uVar11 = (ulong)((int)uVar11 - 1);
              bVar15 = uVar13 != 0;
              uVar13 = uVar13 - 1;
            } while (bVar15);
          }
          lVar7 = lVar9;
          if ((long)(uVar14 + 1) < (long)(p->vType).nSize) {
            do {
              if (((p->vType).pArray[lVar7] & 0xfeU) != 8) break;
              pcVar5 = Mio_GateReadOutName(pGate);
              pcVar6 = Bac_ObjNameStr(p,(int)lVar7);
              fprintf((FILE *)pFile," %s=%s",pcVar5,pcVar6);
              lVar7 = lVar7 + 1;
            } while ((int)lVar7 < (p->vType).nSize);
          }
          fputc(10,(FILE *)pFile);
        }
        else if ((bVar4 & 0xfe) == 10) {
          fwrite(".subckt",7,1,(FILE *)pFile);
          if ((long)(p->vType).nSize <= (long)uVar14) {
LAB_0039d9f7:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          if (((byte)(p->vType).pArray[uVar14] >> 1) - 0x49 < 0xffffffbc) goto LAB_0039da35;
          if ((long)(p->vFanin).nSize <= (long)uVar14) goto LAB_0039da16;
          uVar2 = (p->vFanin).pArray[uVar14];
          pBVar3 = p->pDesign->pNtks;
          pcVar5 = Abc_NamStr((pBVar3[uVar2].pDesign)->pStrs,pBVar3[uVar2].NameId);
          fprintf((FILE *)pFile," %s",pcVar5);
          Bac_ManWriteBlifArray2(pFile,p,(int)uVar14);
        }
        else {
          fwrite(".names",6,1,(FILE *)pFile);
          for (uVar13 = uVar14; uVar13 != 0; uVar13 = uVar13 - 1) {
            if ((p->vType).nSize < (int)uVar13) goto LAB_0039d9f7;
            if (((p->vType).pArray[uVar13 - 1] & 0xfeU) != 6) break;
            if ((p->vFanin).nSize < (int)uVar13) goto LAB_0039da16;
            pcVar5 = Bac_ObjNameStr(p,(p->vFanin).pArray[uVar13 - 1]);
            fprintf((FILE *)pFile," %s",pcVar5);
          }
          iVar8 = (p->vType).nSize;
          lVar7 = (long)iVar8;
          if ((long)(uVar14 + 1) < lVar7) {
            bVar4 = (p->vType).pArray[lVar9];
            lVar7 = lVar12;
            while ((bVar4 & 0xfe) == 8) {
              pcVar5 = Bac_ObjNameStr(p,(int)lVar7 + -1);
              fprintf((FILE *)pFile," %s",pcVar5);
              iVar8 = (p->vType).nSize;
              if (iVar8 <= (int)lVar7) break;
              pbVar1 = (byte *)((p->vType).pArray + lVar7);
              lVar7 = lVar7 + 1;
              bVar4 = *pbVar1;
            }
            lVar7 = (long)iVar8;
          }
          if (lVar7 <= (long)uVar14) goto LAB_0039d9f7;
          bVar4 = ((byte)(p->vType).pArray[uVar14] >> 1) - 6;
          if (0xf < bVar4) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                          ,0x3c0,"char *Ptr_TypeToSop(Bac_ObjType_t)");
          }
          fprintf((FILE *)pFile,"\n%s",&DAT_0097aed0 + *(int *)(&DAT_0097aed0 + (ulong)bVar4 * 4));
        }
      }
      uVar14 = uVar14 + 1;
      lVar9 = lVar9 + 1;
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + 1;
    } while ((long)uVar14 < (long)(p->vType).nSize);
  }
  return;
}

Assistant:

void Bac_ManWriteBlifLines( FILE * pFile, Bac_Ntk_t * p )
{
    int i, k, iTerm;
    Bac_NtkForEachBox( p, i )
    {
        if ( Bac_ObjIsBoxUser(p, i) )
        {
            fprintf( pFile, ".subckt" );
            fprintf( pFile, " %s", Bac_NtkName(Bac_BoxNtk(p, i)) );
            Bac_ManWriteBlifArray2( pFile, p, i );
        }
        else if ( Bac_ObjIsGate(p, i) )
        {
            char * pGateName = Abc_NamStr(p->pDesign->pMods, Bac_BoxNtkId(p, i));
            Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
            Mio_Gate_t * pGate = Mio_LibraryReadGateByName( pLib, pGateName, NULL );
            fprintf( pFile, ".gate %s", pGateName );
            Bac_BoxForEachBi( p, i, iTerm, k )
                fprintf( pFile, " %s=%s", Mio_GateReadPinName(pGate, k), Bac_ObjNameStr(p, iTerm) );
            Bac_BoxForEachBo( p, i, iTerm, k )
                fprintf( pFile, " %s=%s", Mio_GateReadOutName(pGate), Bac_ObjNameStr(p, iTerm) );
            fprintf( pFile, "\n" );
        }
        else
        {
            fprintf( pFile, ".names" );
            Bac_BoxForEachBi( p, i, iTerm, k )
                fprintf( pFile, " %s", Bac_ObjNameStr(p, Bac_ObjFanin(p, iTerm)) );
            Bac_BoxForEachBo( p, i, iTerm, k )
                fprintf( pFile, " %s", Bac_ObjNameStr(p, iTerm) );
            fprintf( pFile, "\n%s",  Ptr_TypeToSop(Bac_ObjType(p, i)) );
        }
    }
}